

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O3

int NET_RecvRaw(int sock,void *buffer,int length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  
  if (sock < 0) {
LAB_00138cc8:
    uVar3 = 0xffffffff;
  }
  else if (length < 1) {
    uVar3 = 0;
  }
  else {
    uVar2 = 0;
    do {
      sVar4 = recv(sock,(void *)((ulong)uVar2 + (long)buffer),(long)(int)(length - uVar2),0);
      uVar1 = (uint)sVar4;
      if (uVar1 == 0xffffffff) {
        piVar5 = __errno_location();
        do {
          if (*piVar5 != 4) goto LAB_00138cc8;
          *piVar5 = 0;
          sVar4 = recv(sock,(void *)((ulong)uVar2 + (long)buffer),(long)(int)(length - uVar2),0);
          uVar1 = (uint)sVar4;
        } while (uVar1 == 0xffffffff);
      }
      uVar3 = uVar1;
    } while (((-1 < (int)uVar1) && (uVar3 = uVar2, uVar1 != 0)) &&
            (uVar2 = uVar1 + uVar2, uVar3 = uVar2, (int)uVar2 < length));
  }
  return uVar3;
}

Assistant:

static int NET_RecvRaw(int sock, void *buffer, int length)
{
  /* Receive exactly length bytes into buffer. Returns number of bytes */
  /* received. Returns -1 in case of error. */


   int nrecv, n;
   char *buf = (char *)buffer;

   if (sock < 0) return -1;
   for (n = 0; n < length; n += nrecv) {
      while ((nrecv = recv(sock, buf+n, length-n, 0)) == -1 && errno == EINTR)
	errno = 0;     /* probably a SIGCLD that was caught */
      if (nrecv < 0)
         return nrecv;
      else if (nrecv == 0)
	break;        /*/ EOF */
   }

   return n;
}